

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderTCTEgl_PatchVerticesIn::initTest
          (TessellationShaderTCTEgl_PatchVerticesIn *this)

{
  _tests *this_00;
  int iVar1;
  deUint32 dVar2;
  uint uVar3;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  uint uVar5;
  uint input_patch_size;
  _test_descriptor test_tes_max_patch_vertices_mul_4;
  _test_descriptor test_tes_half_max_patch_vertices_mul_4;
  _test_descriptor test_tes_4;
  _test_descriptor test_tcs_tes_4;
  _test_descriptor test_tcs_tes_half_max_patch_vertices_mul_4;
  _test_descriptor test_tcs_tes_max_patch_vertices_mul_4;
  long lVar4;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported != false) {
    (**(code **)(lVar4 + 0x708))(1,&this->m_vao_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Could not generate vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xef2);
    (**(code **)(lVar4 + 0xd8))(this->m_vao_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Error binding vertex array object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xef5);
    (**(code **)(lVar4 + 0x868))
              ((this->super_TestCaseBase).m_glExtTokens.MAX_PATCH_VERTICES,
               &this->m_gl_max_patch_vertices_value);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glGetIntegerv() for GL_MAX_PATCH_VERTICES_EXT pname failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xefa);
    uVar5 = this->m_gl_max_patch_vertices_value;
    test_tes_max_patch_vertices_mul_4.type = TESSELLATION_TEST_TYPE_COUNT;
    uVar3 = (uint)((long)(int)uVar5 / 2);
    iVar1 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 |
                        (long)(int)uVar5 / 2 & 0xffffffffU) % 4);
    input_patch_size = (uVar3 - iVar1) + 4;
    if (iVar1 == 0) {
      input_patch_size = uVar3;
    }
    if ((uVar5 & 3) != 0) {
      uVar5 = uVar5 - (int)uVar5 % 4;
    }
    test_tcs_tes_4.fs_id = 0;
    test_tcs_tes_4.po_id = 0;
    test_tcs_tes_4.tcs_id = 0;
    test_tcs_tes_4.tes_id = 0;
    test_tcs_tes_4.vs_id = 0;
    test_tcs_tes_4.input_patch_size = 0;
    test_tcs_tes_half_max_patch_vertices_mul_4.vs_id = 0;
    test_tcs_tes_half_max_patch_vertices_mul_4.input_patch_size = 0;
    test_tcs_tes_half_max_patch_vertices_mul_4.fs_id = 0;
    test_tcs_tes_half_max_patch_vertices_mul_4.po_id = 0;
    test_tcs_tes_half_max_patch_vertices_mul_4.tcs_id = 0;
    test_tcs_tes_half_max_patch_vertices_mul_4.tes_id = 0;
    test_tcs_tes_max_patch_vertices_mul_4.fs_id = 0;
    test_tcs_tes_max_patch_vertices_mul_4.po_id = 0;
    test_tcs_tes_max_patch_vertices_mul_4.tcs_id = 0;
    test_tcs_tes_max_patch_vertices_mul_4.tes_id = 0;
    test_tcs_tes_max_patch_vertices_mul_4.vs_id = 0;
    test_tcs_tes_max_patch_vertices_mul_4.input_patch_size = 0;
    test_tes_4.vs_id = 0;
    test_tes_4.input_patch_size = 0;
    test_tes_4.fs_id = 0;
    test_tes_4.po_id = 0;
    test_tes_4.tcs_id = 0;
    test_tes_4.tes_id = 0;
    test_tes_half_max_patch_vertices_mul_4.vs_id = 0;
    test_tes_half_max_patch_vertices_mul_4.input_patch_size = 0;
    test_tes_half_max_patch_vertices_mul_4.fs_id = 0;
    test_tes_half_max_patch_vertices_mul_4.po_id = 0;
    test_tes_half_max_patch_vertices_mul_4.tcs_id = 0;
    test_tes_half_max_patch_vertices_mul_4.tes_id = 0;
    test_tes_max_patch_vertices_mul_4.fs_id = 0;
    test_tes_max_patch_vertices_mul_4.po_id = 0;
    test_tes_max_patch_vertices_mul_4.tcs_id = 0;
    test_tes_max_patch_vertices_mul_4.tes_id = 0;
    test_tes_max_patch_vertices_mul_4.vs_id = 0;
    test_tes_max_patch_vertices_mul_4.input_patch_size = 0;
    test_tes_half_max_patch_vertices_mul_4.type = test_tes_max_patch_vertices_mul_4.type;
    test_tes_4.type = test_tes_max_patch_vertices_mul_4.type;
    test_tcs_tes_4.type = test_tes_max_patch_vertices_mul_4.type;
    test_tcs_tes_half_max_patch_vertices_mul_4.type = test_tes_max_patch_vertices_mul_4.type;
    test_tcs_tes_max_patch_vertices_mul_4.type = test_tes_max_patch_vertices_mul_4.type;
    initTestDescriptor(this,TESSELLATION_TEST_TYPE_FIRST,&test_tcs_tes_4,4);
    initTestDescriptor(this,TESSELLATION_TEST_TYPE_FIRST,&test_tcs_tes_half_max_patch_vertices_mul_4
                       ,input_patch_size);
    initTestDescriptor(this,TESSELLATION_TEST_TYPE_FIRST,&test_tcs_tes_max_patch_vertices_mul_4,
                       uVar5);
    uVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar3 & 0x300) != 0) {
      initTestDescriptor(this,TESSELLATION_TEST_TYPE_TES,&test_tes_4,4);
      initTestDescriptor(this,TESSELLATION_TEST_TYPE_TES,&test_tes_half_max_patch_vertices_mul_4,
                         input_patch_size);
      initTestDescriptor(this,TESSELLATION_TEST_TYPE_TES,&test_tes_max_patch_vertices_mul_4,uVar5);
    }
    this_00 = &this->m_tests;
    std::
    vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
    ::push_back(this_00,&test_tcs_tes_4);
    std::
    vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
    ::push_back(this_00,&test_tcs_tes_half_max_patch_vertices_mul_4);
    std::
    vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
    ::push_back(this_00,&test_tcs_tes_max_patch_vertices_mul_4);
    uVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar5 & 0x300) != 0) {
      std::
      vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
      ::push_back(this_00,&test_tes_4);
      std::
      vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
      ::push_back(this_00,&test_tes_half_max_patch_vertices_mul_4);
      std::
      vector<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
      ::push_back(this_00,&test_tes_max_patch_vertices_mul_4);
    }
    (**(code **)(lVar4 + 0x6c8))(1,&this->m_bo_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glGenBuffers() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xf34);
    (**(code **)(lVar4 + 0x40))(0x8c8e,this->m_bo_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glBindBuffer() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xf37);
    (**(code **)(lVar4 + 0x48))(0x8c8e,0,this->m_bo_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glBindBufferBase() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xf39);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_tcs_tes_4,"Tessellation shader functionality not supported, skipping",
             (allocator<char> *)&test_tcs_tes_half_max_patch_vertices_mul_4);
  tcu::NotSupportedError::NotSupportedError(this_01,(string *)&test_tcs_tes_4);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderTCTEgl_PatchVerticesIn::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* The test requires EXT_tessellation_shader */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve GL_MAX_PATCH_VERTICES_EXT value before we carry on */
	gl.getIntegerv(m_glExtTokens.MAX_PATCH_VERTICES, &m_gl_max_patch_vertices_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_PATCH_VERTICES_EXT pname failed");

	/* Initialize test descriptors.
	 *
	 * Make sure the values we use are multiples of 4 - this is because we're using isolines in the
	 * tessellation stage, and in order to have the requested amount of line segments generated, we need
	 * to use a multiply of 4 vertices per patch */
	glw::GLint n_half_max_patch_vertices_mul_4 = m_gl_max_patch_vertices_value / 2;
	glw::GLint n_max_patch_vertices_mul_4	  = m_gl_max_patch_vertices_value;

	if ((n_half_max_patch_vertices_mul_4 % 4) != 0)
	{
		/* Round to nearest mul-of-4 integer */
		n_half_max_patch_vertices_mul_4 += (4 - (m_gl_max_patch_vertices_value / 2) % 4);
	}

	if ((n_max_patch_vertices_mul_4 % 4) != 0)
	{
		/* Round to previous nearest mul-of-4 integer */
		n_max_patch_vertices_mul_4 -= (m_gl_max_patch_vertices_value % 4);
	}

	_test_descriptor test_tcs_tes_4;
	_test_descriptor test_tcs_tes_half_max_patch_vertices_mul_4;
	_test_descriptor test_tcs_tes_max_patch_vertices_mul_4;
	_test_descriptor test_tes_4;
	_test_descriptor test_tes_half_max_patch_vertices_mul_4;
	_test_descriptor test_tes_max_patch_vertices_mul_4;

	initTestDescriptor(TESSELLATION_TEST_TYPE_TCS_TES, &test_tcs_tes_4, 4);
	initTestDescriptor(TESSELLATION_TEST_TYPE_TCS_TES, &test_tcs_tes_half_max_patch_vertices_mul_4,
					   n_half_max_patch_vertices_mul_4);
	initTestDescriptor(TESSELLATION_TEST_TYPE_TCS_TES, &test_tcs_tes_max_patch_vertices_mul_4,
					   n_max_patch_vertices_mul_4);
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		initTestDescriptor(TESSELLATION_TEST_TYPE_TES, &test_tes_4, 4);
		initTestDescriptor(TESSELLATION_TEST_TYPE_TES, &test_tes_half_max_patch_vertices_mul_4,
						   n_half_max_patch_vertices_mul_4);
		initTestDescriptor(TESSELLATION_TEST_TYPE_TES, &test_tes_max_patch_vertices_mul_4, n_max_patch_vertices_mul_4);
	}

	m_tests.push_back(test_tcs_tes_4);
	m_tests.push_back(test_tcs_tes_half_max_patch_vertices_mul_4);
	m_tests.push_back(test_tcs_tes_max_patch_vertices_mul_4);
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		m_tests.push_back(test_tes_4);
		m_tests.push_back(test_tes_half_max_patch_vertices_mul_4);
		m_tests.push_back(test_tes_max_patch_vertices_mul_4);
	}

	/* Generate and set up a buffer object we will use to hold XFBed data.
	 *
	 * NOTE: We do not set the buffer object's storage here because its size
	 *       is iteration-specific.
	 **/
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed");

	/* We're good to execute the test! */
}